

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DividerClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DividerClauseSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  DividerClauseSyntax *pDVar11;
  
  pDVar11 = (DividerClauseSyntax *)allocate(this,0x38,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pDVar11->super_SyntaxNode).kind = DividerClause;
  (pDVar11->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar11->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pDVar11->divide).kind = TVar3;
  (pDVar11->divide).field_0x2 = uVar4;
  (pDVar11->divide).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar11->divide).rawLen = uVar6;
  (pDVar11->divide).info = pIVar1;
  (pDVar11->value).kind = TVar7;
  (pDVar11->value).field_0x2 = uVar8;
  (pDVar11->value).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar11->value).rawLen = uVar10;
  (pDVar11->value).info = pIVar2;
  return pDVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }